

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

NonMaximumSuppressionLayerParams *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::NonMaximumSuppressionLayerParams>(Arena *arena)

{
  NonMaximumSuppressionLayerParams *pNVar1;
  
  if (arena != (Arena *)0x0) {
    pNVar1 = DoCreateMessage<CoreML::Specification::NonMaximumSuppressionLayerParams>(arena);
    return pNVar1;
  }
  pNVar1 = (NonMaximumSuppressionLayerParams *)operator_new(0x28);
  CoreML::Specification::NonMaximumSuppressionLayerParams::NonMaximumSuppressionLayerParams
            (pNVar1,(Arena *)0x0,false);
  return pNVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }